

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::Mutex::LockSlowLoop(Mutex *this,SynchWaitParams *waitp,int flags)

{
  long lVar1;
  ulong uVar2;
  PerThreadSynch *pPVar3;
  ulong uVar4;
  bool bVar5;
  byte local_959;
  byte local_952;
  byte local_239;
  char *absl_raw_log_internal_basename_4;
  char *absl_raw_log_internal_basename_3;
  char *absl_raw_log_internal_basename_2;
  intptr_t wr_wait;
  PerThreadSynch *new_h_1;
  PerThreadSynch *h_1;
  PerThreadSynch *h;
  char *absl_raw_log_internal_basename_1;
  intptr_t nv;
  PerThreadSynch *new_h;
  bool dowait;
  char *absl_raw_log_internal_basename;
  ulong local_1b0;
  intptr_t v;
  ScopedDisable local_19d;
  int c;
  ScopedDisable disable_rescheduling;
  SynchWaitParams *pSStack_198;
  int flags_local;
  SynchWaitParams *waitp_local;
  Mutex *this_local;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  c = flags;
  pSStack_198 = waitp;
  base_internal::SchedulingGuard::ScopedDisable::ScopedDisable(&local_19d);
  v._4_4_ = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if (((this->mu_).super___atomic_base<long>._M_i & 0x10U) != 0) {
    bVar5 = pSStack_198->how != (MuHow)kExclusiveS;
    PostSynchEvent(this,bVar5 + 4 + (uint)bVar5);
  }
  local_239 = 1;
  if (pSStack_198->thread->waitp != (SynchWaitParams *)0x0) {
    local_239 = pSStack_198->thread->suppress_fatal_errors;
  }
  if (((local_239 ^ 0xff) & 1) != 0) {
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x7d6,"Check %s failed: %s",
               "waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors",
               "detected illegal recursion into Mutex code");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x7d6,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
  }
  do {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    local_1b0 = (this->mu_).super___atomic_base<long>._M_i;
    CheckForMutexCorruption(local_1b0,"Lock");
    if ((local_1b0 & pSStack_198->how->slow_need_zero) == 0) {
      uVar4 = pSStack_198->how->fast_or;
      uVar2 = ClearDesignatedWakerMask(c & 1);
      LOCK();
      bVar5 = local_1b0 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar5) {
        (this->mu_).super___atomic_base<long>._M_i =
             (uVar4 | local_1b0 & uVar2) + pSStack_198->how->fast_add;
      }
      UNLOCK();
      if (bVar5) {
        if ((pSStack_198->cond == (Condition *)0x0) ||
           (bVar5 = EvalConditionAnnotated
                              (pSStack_198->cond,this,true,false,pSStack_198->how == (MuHow)kSharedS
                              ), bVar5)) {
LAB_008ca613:
          local_959 = 1;
          if (pSStack_198->thread->waitp != (SynchWaitParams *)0x0) {
            local_959 = pSStack_198->thread->suppress_fatal_errors;
          }
          if (((local_959 ^ 0xff) & 1) == 0) {
            if ((local_1b0 & 0x10) != 0) {
              bVar5 = pSStack_198->how != (MuHow)kExclusiveS;
              PostSynchEvent(this,bVar5 + 5 + (uint)bVar5);
            }
            base_internal::SchedulingGuard::ScopedDisable::~ScopedDisable(&local_19d);
            return;
          }
          raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x83d,"Check %s failed: %s",
                     "waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors",
                     "detected illegal recursion into Mutex code");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x83d,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
        }
        UnlockSlow(this,pSStack_198);
        Block(this,pSStack_198->thread);
        c = c | 1;
        v._4_4_ = 0;
      }
    }
    else {
      new_h._7_1_ = false;
      if ((local_1b0 & 0x44) == 0) {
        pPVar3 = Enqueue((PerThreadSynch *)0x0,pSStack_198,local_1b0,c);
        uVar4 = ClearDesignatedWakerMask(c & 1);
        uVar4 = local_1b0 & uVar4 & 0xff;
        absl_raw_log_internal_basename_1 = (char *)(uVar4 | 4);
        if (pPVar3 == (PerThreadSynch *)0x0) {
          raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x7f3,"Check %s failed: %s","new_h != nullptr",
                     "Enqueue to empty list failed");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x7f3,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
        }
        if ((pSStack_198->how == (MuHow)kExclusiveS) && ((local_1b0 & 1) != 0)) {
          absl_raw_log_internal_basename_1 = (char *)(uVar4 | 0x24);
        }
        LOCK();
        bVar5 = local_1b0 == (this->mu_).super___atomic_base<long>._M_i;
        if (bVar5) {
          (this->mu_).super___atomic_base<long>._M_i =
               (ulong)pPVar3 | (ulong)absl_raw_log_internal_basename_1;
        }
        UNLOCK();
        bVar5 = !bVar5;
        if (bVar5) {
          pSStack_198->thread->waitp = (SynchWaitParams *)0x0;
        }
        new_h._7_1_ = !bVar5;
      }
      else {
        uVar4 = pSStack_198->how->slow_inc_need_zero;
        uVar2 = IgnoreWaitingWritersMask(c & 1);
        if ((local_1b0 & uVar4 & uVar2) == 0) {
          uVar4 = ClearDesignatedWakerMask(c & 1);
          LOCK();
          bVar5 = local_1b0 == (this->mu_).super___atomic_base<long>._M_i;
          if (bVar5) {
            (this->mu_).super___atomic_base<long>._M_i = local_1b0 & uVar4 | 0x41;
          }
          UNLOCK();
          if (bVar5) {
            pPVar3 = GetPerThreadSynch(local_1b0);
            pPVar3->readers = pPVar3->readers + 0x100;
            do {
              std::operator&(memory_order_relaxed,__memory_order_mask);
              local_1b0 = (this->mu_).super___atomic_base<long>._M_i;
              LOCK();
              bVar5 = local_1b0 == (this->mu_).super___atomic_base<long>._M_i;
              if (bVar5) {
                (this->mu_).super___atomic_base<long>._M_i = local_1b0 & 0xffffffffffffffbf | 1;
              }
              UNLOCK();
            } while (!bVar5);
            if ((pSStack_198->cond == (Condition *)0x0) ||
               (bVar5 = EvalConditionAnnotated
                                  (pSStack_198->cond,this,true,false,
                                   pSStack_198->how == (MuHow)kSharedS), bVar5)) goto LAB_008ca613;
            UnlockSlow(this,pSStack_198);
            Block(this,pSStack_198->thread);
            c = c | 1;
            v._4_4_ = 0;
          }
        }
        else if ((local_1b0 & 0x40) == 0) {
          uVar4 = ClearDesignatedWakerMask(c & 1);
          LOCK();
          bVar5 = local_1b0 == (this->mu_).super___atomic_base<long>._M_i;
          if (bVar5) {
            (this->mu_).super___atomic_base<long>._M_i = local_1b0 & uVar4 | 0x44;
          }
          UNLOCK();
          if (bVar5) {
            pPVar3 = GetPerThreadSynch(local_1b0);
            pPVar3 = Enqueue(pPVar3,pSStack_198,local_1b0,c);
            absl_raw_log_internal_basename_2 = (char *)0x0;
            if (pPVar3 == (PerThreadSynch *)0x0) {
              raw_log_internal::RawLog
                        (kFatal,"mutex.cc",0x822,"Check %s failed: %s","new_h != nullptr",
                         "Enqueue to list failed");
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                            ,0x822,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
            }
            if ((pSStack_198->how == (MuHow)kExclusiveS) && ((local_1b0 & 1) != 0)) {
              absl_raw_log_internal_basename_2 = (char *)0x20;
            }
            do {
              std::operator&(memory_order_relaxed,__memory_order_mask);
              lVar1 = (this->mu_).super___atomic_base<long>._M_i;
              LOCK();
              bVar5 = lVar1 == (this->mu_).super___atomic_base<long>._M_i;
              if (bVar5) {
                (this->mu_).super___atomic_base<long>._M_i =
                     (ulong)((uint)lVar1 & 0xbb) | (ulong)absl_raw_log_internal_basename_2 |
                     (ulong)pPVar3 | 4;
              }
              UNLOCK();
            } while (!bVar5);
            new_h._7_1_ = true;
          }
        }
      }
      if (new_h._7_1_) {
        Block(this,pSStack_198->thread);
        c = c | 1;
        v._4_4_ = 0;
      }
    }
    local_952 = 1;
    if (pSStack_198->thread->waitp != (SynchWaitParams *)0x0) {
      local_952 = pSStack_198->thread->suppress_fatal_errors;
    }
    if (((local_952 ^ 0xff) & 1) != 0) {
      raw_log_internal::RawLog
                (kFatal,"mutex.cc",0x837,"Check %s failed: %s",
                 "waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors",
                 "detected illegal recursion into Mutex code");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x837,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
    }
    v._4_4_ = synchronization_internal::MutexDelay(v._4_4_,1);
  } while( true );
}

Assistant:

void Mutex::LockSlowLoop(SynchWaitParams* waitp, int flags) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(
        this, waitp->how == kExclusive ? SYNCH_EV_LOCK : SYNCH_EV_READERLOCK);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    CheckForMutexCorruption(v, "Lock");
    if ((v & waitp->how->slow_need_zero) == 0) {
      if (mu_.compare_exchange_strong(
              v,
              (waitp->how->fast_or |
               (v & ClearDesignatedWakerMask(flags & kMuHasBlocked))) +
                  waitp->how->fast_add,
              std::memory_order_acquire, std::memory_order_relaxed)) {
        if (waitp->cond == nullptr ||
            EvalConditionAnnotated(waitp->cond, this, true, false,
                                   waitp->how == kShared)) {
          break;  // we timed out, or condition true, so return
        }
        this->UnlockSlow(waitp);  // got lock but condition false
        this->Block(waitp->thread);
        flags |= kMuHasBlocked;
        c = 0;
      }
    } else {  // need to access waiter list
      bool dowait = false;
      if ((v & (kMuSpin | kMuWait)) == 0) {  // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch* new_h = Enqueue(nullptr, waitp, v, flags);
        intptr_t nv =
            (v & ClearDesignatedWakerMask(flags & kMuHasBlocked) & kMuLow) |
            kMuWait;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to empty list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          nv |= kMuWrWait;
        }
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | nv,
                std::memory_order_release, std::memory_order_relaxed)) {
          dowait = true;
        } else {  // attempted Enqueue() failed
          // zero out the waitp field set by Enqueue()
          waitp->thread->waitp = nullptr;
        }
      } else if ((v & waitp->how->slow_inc_need_zero &
                  IgnoreWaitingWritersMask(flags & kMuHasBlocked)) == 0) {
        // This is a reader that needs to increment the reader count,
        // but the count is currently held in the last waiter.
        if (mu_.compare_exchange_strong(
                v,
                (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                    kMuSpin | kMuReader,
                std::memory_order_acquire, std::memory_order_relaxed)) {
          PerThreadSynch* h = GetPerThreadSynch(v);
          h->readers += kMuOne;  // inc reader count in waiter
          do {                   // release spinlock
            v = mu_.load(std::memory_order_relaxed);
          } while (!mu_.compare_exchange_weak(v, (v & ~kMuSpin) | kMuReader,
                                              std::memory_order_release,
                                              std::memory_order_relaxed));
          if (waitp->cond == nullptr ||
              EvalConditionAnnotated(waitp->cond, this, true, false,
                                     waitp->how == kShared)) {
            break;  // we timed out, or condition true, so return
          }
          this->UnlockSlow(waitp);  // got lock but condition false
          this->Block(waitp->thread);
          flags |= kMuHasBlocked;
          c = 0;
        }
      } else if ((v & kMuSpin) == 0 &&  // attempt to queue ourselves
                 mu_.compare_exchange_strong(
                     v,
                     (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                         kMuSpin | kMuWait,
                     std::memory_order_acquire, std::memory_order_relaxed)) {
        PerThreadSynch* h = GetPerThreadSynch(v);
        PerThreadSynch* new_h = Enqueue(h, waitp, v, flags);
        intptr_t wr_wait = 0;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          wr_wait = kMuWrWait;  // give priority to a waiting writer
        }
        do {  // release spinlock
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v,
            (v & (kMuLow & ~kMuSpin)) | kMuWait | wr_wait |
                reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        dowait = true;
      }
      if (dowait) {
        this->Block(waitp->thread);  // wait until removed from list or timeout
        flags |= kMuHasBlocked;
        c = 0;
      }
    }
    ABSL_RAW_CHECK(
        waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
        "detected illegal recursion into Mutex code");
    // delay, then try again
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(this, waitp->how == kExclusive
                             ? SYNCH_EV_LOCK_RETURNING
                             : SYNCH_EV_READERLOCK_RETURNING);
  }
}